

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::
stringifyBinaryExpr<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>>
          (String *__return_storage_ptr__,detail *this,
          KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> *lhs,char *op,
          KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> *rhs)

{
  String local_70;
  String local_58;
  String local_40;
  String local_28;
  
  String::String(&local_40,"{?}");
  String::String(&local_58,(char *)lhs);
  String::operator+(&local_28,&local_40,&local_58);
  String::String(&local_70,"{?}");
  String::operator+(__return_storage_ptr__,&local_28,&local_70);
  String::~String(&local_70);
  String::~String(&local_28);
  String::~String(&local_58);
  String::~String(&local_40);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }